

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceBuffer * __thiscall
slang::SourceManager::cacheBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,path *path,
          SourceLocation includedFrom,vector<char,_std::allocator<char>_> *buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  pointer pcVar4;
  char *pcVar5;
  long lVar6;
  pointer *__ptr;
  path *__p;
  unique_lock<std::shared_mutex> *puVar7;
  pair<std::_Rb_tree_iterator<std::filesystem::__cxx11::path>,_bool> pVar8;
  pair<_3562ccc5_> pVar9;
  __single_object fd;
  string name;
  unique_lock<std::shared_mutex> lock;
  __uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
  local_d8;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  path local_a8;
  path local_80;
  SourceLocation local_58;
  unique_lock<std::shared_mutex> local_50;
  long local_40;
  
  local_c8 = &local_b8;
  local_c0 = (char *)0x0;
  local_b8._M_local_buf[0] = '\0';
  puVar7 = (unique_lock<std::shared_mutex> *)buffer;
  local_58 = includedFrom;
  if (this->disableProximatePaths == false) {
    local_d8._M_t.
    super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
    .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
         (tuple<slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          )((ulong)local_d8._M_t.
                   super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                   .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl &
           0xffffffff00000000);
    local_d0 = std::_V2::system_category();
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::proximate(&local_80,path,(error_code *)&local_a8);
    std::filesystem::__cxx11::path::~path(&local_a8);
    local_50._M_device = (mutex_type *)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_80._M_pathname._M_dataplus._M_p,
               local_80._M_pathname._M_dataplus._M_p + local_80._M_pathname._M_string_length);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_50);
    if (local_50._M_device != (mutex_type *)&local_40) {
      operator_delete(local_50._M_device,local_40 + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_80);
    if ((int)local_d8._M_t.
             super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
             .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl != 0) {
      puVar7 = (unique_lock<std::shared_mutex> *)0x0;
      std::__cxx11::string::_M_replace((ulong)&local_c8,0,local_c0,0);
    }
  }
  if (local_c0 != (char *)0x0) goto LAB_001a90b9;
  sVar2 = (path->_M_pathname)._M_string_length;
  if (sVar2 == 0) {
LAB_001a9058:
    std::filesystem::__cxx11::path::path(&local_a8);
  }
  else {
    _Var3._M_head_impl =
         (path->_M_cmpts)._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    __p = path;
    if ((~(byte)_Var3._M_head_impl & 3) != 0) {
      if ((((ulong)_Var3._M_head_impl & 3) == 0) &&
         ((path->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
        if (((ulong)_Var3._M_head_impl & 3) == 0) {
          lVar6 = std::filesystem::__cxx11::path::_List::end();
        }
        else {
          lVar6 = 0;
        }
        __p = (path *)(lVar6 + -0x30);
        if ((*(byte *)&(path->_M_cmpts)._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl & 3) != 0) {
          __p = path;
        }
        if ((~*(uint *)&(__p->_M_cmpts)._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl & 3) == 0) goto LAB_001a904c;
      }
      goto LAB_001a9058;
    }
LAB_001a904c:
    std::filesystem::__cxx11::path::path(&local_a8,__p);
  }
  paVar1 = &local_80._M_pathname.field_2;
  local_80._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_a8._M_pathname._M_dataplus._M_p,
             local_a8._M_pathname._M_dataplus._M_p + local_a8._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_pathname._M_dataplus._M_p,
                    local_80._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_a8);
LAB_001a90b9:
  local_50._M_owns = false;
  local_50._M_device = &this->mut;
  std::unique_lock<std::shared_mutex>::lock(&local_50);
  local_50._M_owns = true;
  std::filesystem::__cxx11::path::parent_path();
  pVar8 = std::
          _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          ::_M_insert_unique<std::filesystem::__cxx11::path>(&(this->directories)._M_t,&local_a8);
  local_d8._M_t.
  super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
  .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
       (tuple<slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        )operator_new(0x58);
  pcVar5 = local_c0;
  paVar1 = &local_80._M_pathname.field_2;
  if (local_c8 == &local_b8) {
    local_80._M_pathname.field_2._8_8_ = local_b8._8_8_;
    local_80._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80._M_pathname._M_dataplus._M_p = (pointer)local_c8;
  }
  local_80._M_pathname.field_2._M_allocated_capacity._1_7_ = local_b8._M_allocated_capacity._1_7_;
  local_80._M_pathname.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
  local_c0 = (char *)0x0;
  local_b8._M_local_buf[0] = '\0';
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)local_d8._M_t.
       super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
       .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_d8._M_t.
                 super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                 .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x10
          );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_pathname._M_dataplus._M_p == paVar1) {
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)local_d8._M_t.
               super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
               .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x10))
    ->_M_allocated_capacity = local_80._M_pathname.field_2._M_allocated_capacity;
    *(undefined8 *)
     ((long)local_d8._M_t.
            super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
            .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x18) =
         local_80._M_pathname.field_2._8_8_;
  }
  else {
    *(pointer *)
     local_d8._M_t.
     super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
     .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
         local_80._M_pathname._M_dataplus._M_p;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)local_d8._M_t.
               super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
               .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x10))
    ->_M_allocated_capacity = local_80._M_pathname.field_2._M_allocated_capacity;
  }
  *(char **)((long)local_d8._M_t.
                   super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                   .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 8)
       = pcVar5;
  local_80._M_pathname._M_string_length = 0;
  local_80._M_pathname.field_2._M_allocated_capacity =
       (ulong)(uint7)local_b8._M_allocated_capacity._1_7_ << 8;
  (((vector<char,_std::allocator<char>_> *)
   ((long)local_d8._M_t.
          super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x20))->
  super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start =
       (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)
   ((long)local_d8._M_t.
          super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x28) =
       (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  *(pointer *)
   ((long)local_d8._M_t.
          super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x30) =
       (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(pointer *)
   ((long)local_d8._M_t.
          super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x48) =
       (pointer)0x0;
  (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
   ((long)local_d8._M_t.
          super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x38))->
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  *(pointer *)
   ((long)local_d8._M_t.
          super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl + 0x40) =
       (pointer)0x0;
  *(path **)((long)local_d8._M_t.
                   super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                   .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl +
            0x50) = (path *)(pVar8.first._M_node._M_node + 1);
  local_c8 = &local_b8;
  local_80._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::filesystem::__cxx11::path::~path(&local_a8);
  paVar1 = &local_a8._M_pathname.field_2;
  pcVar4 = (path->_M_pathname)._M_dataplus._M_p;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar4,pcVar4 + (path->_M_pathname)._M_string_length);
  pVar9 = ska::detailv3::
          sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
          ::
          emplace<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>
                    ((sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                      *)&this->lookupCache,&local_a8._M_pathname,
                     (unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                      *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    assert::assertFailed
              ("inserted",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
               ,0x21b,
               "SourceBuffer slang::SourceManager::cacheBuffer(const fs::path &, SourceLocation, std::vector<char> &&)"
              );
  }
  createBufferEntry(__return_storage_ptr__,this,
                    ((pVar9.first.current.current)->field_1).value.second._M_t.
                    super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                    .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl,
                    local_58,puVar7);
  if ((_Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
       )local_d8._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl !=
      (FileData *)0x0) {
    std::default_delete<slang::SourceManager::FileData>::operator()
              ((default_delete<slang::SourceManager::FileData> *)&local_d8,
               (FileData *)
               local_d8._M_t.
               super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
               .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_50);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SourceBuffer SourceManager::cacheBuffer(const fs::path& path, SourceLocation includedFrom,
                                        std::vector<char>&& buffer) {
    std::string name;
    if (!disableProximatePaths) {
        std::error_code ec;
        name = fs::proximate(path, ec).u8string();
        if (ec)
            name = {};
    }

    if (name.empty())
        name = path.filename().u8string();

    std::unique_lock lock(mut);

    auto fd = std::make_unique<FileData>(&*directories.insert(path.parent_path()).first,
                                         std::move(name), std::move(buffer));

    auto [it, inserted] = lookupCache.emplace(path.u8string(), std::move(fd));
    ASSERT(inserted);

    FileData* fdPtr = it->second.get();
    return createBufferEntry(fdPtr, includedFrom, lock);
}